

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t create_overflow_bucket
                    (int bucket_idx,ion_fpos_t *overflow_loc,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  ion_err_t iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  undefined8 uStack_40;
  int local_38 [2];
  linear_hash_bucket_t bucket;
  
  local_38[1] = 0;
  bucket._0_8_ = -1;
  if (bucket_idx < linear_hash->bucket_map->current_size) {
    bucket._0_8_ = linear_hash->bucket_map->data[bucket_idx];
  }
  uStack_40 = 0x1154c6;
  local_38[0] = bucket_idx;
  iVar3 = fseek((FILE *)linear_hash->database,0,2);
  iVar2 = '\r';
  if (iVar3 == 0) {
    uStack_40 = 0x1154da;
    lVar4 = ftell((FILE *)linear_hash->database);
    *overflow_loc = lVar4;
    uStack_40 = 0x1154ed;
    iVar2 = array_list_insert(bucket_idx,lVar4,linear_hash->bucket_map);
    if (iVar2 == '\0') {
      uStack_40 = 0x11550f;
      sVar5 = fwrite(local_38,0x10,1,(FILE *)linear_hash->database);
      iVar2 = '\a';
      if (sVar5 == 1) {
        lVar4 = -((long)(linear_hash->super).record.key_size +
                  (long)(linear_hash->super).record.value_size + 0x13U & 0xfffffffffffffff0);
        iVar3 = (linear_hash->super).record.key_size;
        iVar1 = (linear_hash->super).record.value_size;
        iVar6 = 0;
        *(undefined8 *)((long)&uStack_40 + lVar4) = 0x11554f;
        memset((void *)((long)local_38 + lVar4),0,(long)iVar1 + (long)iVar3);
        if (0 < linear_hash->records_per_bucket) {
          do {
            iVar3 = (linear_hash->super).record.key_size;
            iVar1 = (linear_hash->super).record.value_size;
            __s = (FILE *)linear_hash->database;
            *(undefined8 *)((long)&uStack_40 + lVar4) = 0x115576;
            sVar5 = fwrite((void *)((long)local_38 + lVar4),(long)iVar1 + (long)iVar3 + 4,1,__s);
            if (sVar5 != 1) {
              iVar6 = 7;
              goto LAB_0011558d;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < linear_hash->records_per_bucket);
          iVar6 = 0;
        }
LAB_0011558d:
        iVar2 = (ion_err_t)iVar6;
      }
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
create_overflow_bucket(
	int					bucket_idx,
	ion_fpos_t			*overflow_loc,
	linear_hash_table_t *linear_hash
) {
	ion_err_t err = err_uninitialized;

	/* initialize bucket fields */
	linear_hash_bucket_t bucket;

	bucket.idx					= bucket_idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= array_list_get(bucket_idx, linear_hash->bucket_map);

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	/* get overflow location for new overflow bucket */
	*overflow_loc	= ftell(linear_hash->database);

	err				= array_list_insert(bucket.idx, *overflow_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	/* write to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	return err_ok;
}